

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.cpp
# Opt level: O0

string * __thiscall
arbiter::Endpoint::prefixedRoot_abi_cxx11_(string *__return_storage_ptr__,Endpoint *this)

{
  string local_58;
  string local_38;
  Endpoint *local_18;
  Endpoint *this_local;
  
  local_18 = this;
  this_local = (Endpoint *)__return_storage_ptr__;
  softPrefix_abi_cxx11_(&local_38,this);
  root_abi_cxx11_(&local_58,this);
  ::std::operator+(__return_storage_ptr__,&local_38,&local_58);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string Endpoint::prefixedRoot() const
{
    return softPrefix() + root();
}